

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O1

shared_ptr<f8n::prefs::Preferences> __thiscall
f8n::prefs::Preferences::ForPlugin(Preferences *this,string *pluginName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  size_type sVar6;
  iterator iVar7;
  Preferences *this_00;
  mapped_type *pmVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  long lVar10;
  size_type sVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  _Alloc_hider _Var13;
  char *pcVar14;
  shared_ptr<f8n::prefs::Preferences> sVar15;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  key_type local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar3 = (pluginName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar3,pcVar3 + pluginName->_M_string_length);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_98._M_dataplus._M_p + local_98._M_string_length);
  _Var13._M_p = local_98._M_dataplus._M_p;
  if (0 < (long)local_98._M_string_length >> 2) {
    _Var13._M_p = local_98._M_dataplus._M_p + (local_98._M_string_length & 0xfffffffffffffffc);
    lVar10 = ((long)local_98._M_string_length >> 2) + 1;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_98._M_dataplus._M_p + 3);
    do {
      iVar5 = isspace((int)paVar12->_M_local_buf[-3]);
      if (iVar5 != 0) {
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar12->_M_local_buf + -3);
        goto LAB_001d3d6a;
      }
      iVar5 = isspace((int)paVar12->_M_local_buf[-2]);
      if (iVar5 != 0) {
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar12->_M_local_buf + -2);
        goto LAB_001d3d6a;
      }
      iVar5 = isspace((int)paVar12->_M_local_buf[-1]);
      if (iVar5 != 0) {
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar12->_M_local_buf + -1);
        goto LAB_001d3d6a;
      }
      iVar5 = isspace((int)paVar12->_M_local_buf[0]);
      if (iVar5 != 0) goto LAB_001d3d6a;
      lVar10 = lVar10 + -1;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar12->_M_local_buf + 4);
    } while (1 < lVar10);
  }
  lVar10 = (long)paVar1 - (long)_Var13._M_p;
  if (lVar10 != 1) {
    if (lVar10 != 2) {
      paVar12 = paVar1;
      if ((lVar10 != 3) ||
         (iVar5 = isspace((int)*_Var13._M_p),
         paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)_Var13._M_p, iVar5 != 0)) goto LAB_001d3d6a;
      _Var13._M_p = _Var13._M_p + 1;
    }
    iVar5 = isspace((int)*_Var13._M_p);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var13._M_p;
    if (iVar5 != 0) goto LAB_001d3d6a;
    _Var13._M_p = _Var13._M_p + 1;
  }
  iVar5 = isspace((int)*_Var13._M_p);
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var13._M_p;
  if (iVar5 == 0) {
    paVar12 = paVar1;
  }
LAB_001d3d6a:
  pcVar14 = paVar12->_M_local_buf + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar14 != paVar1 && paVar12 != paVar1) {
    do {
      cVar2 = *pcVar14;
      iVar5 = isspace((int)cVar2);
      if (iVar5 == 0) {
        paVar12->_M_local_buf[0] = cVar2;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar12->_M_local_buf + 1);
      }
      pcVar14 = pcVar14 + 1;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pcVar14 != paVar1);
  }
  _Var13._M_p = local_98._M_dataplus._M_p;
  sVar6 = (long)paVar12 - (long)local_98._M_dataplus._M_p;
  paVar12->_M_local_buf[0] = '\0';
  local_98._M_string_length = sVar6;
  if (sVar6 != 0) {
    sVar11 = 0;
    do {
      iVar5 = tolower((int)_Var13._M_p[sVar11]);
      _Var13._M_p[sVar11] = (char)iVar5;
      sVar11 = sVar11 + 1;
    } while (sVar6 != sVar11);
  }
  std::operator+(&local_58,"plugin_",&local_98);
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == &local_98.field_2) {
    local_78.field_2._8_8_ = local_98.field_2._8_8_;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    local_78._M_dataplus._M_p = local_98._M_dataplus._M_p;
  }
  local_78.field_2._M_allocated_capacity._1_7_ = local_98.field_2._M_allocated_capacity._1_7_;
  local_78.field_2._M_local_buf[0] = local_98.field_2._M_local_buf[0];
  local_78._M_string_length = local_98._M_string_length;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  iVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<f8n::prefs::Preferences>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<f8n::prefs::Preferences>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&pluginCache_abi_cxx11_._M_h,&local_78);
  if (iVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<f8n::prefs::Preferences>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    this_00 = (Preferences *)operator_new(0x68);
    Preferences(this_00,&local_78,ModeAutoSave);
    local_58._M_dataplus._M_p = (pointer)this_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<f8n::prefs::Preferences*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length,this_00);
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<f8n::prefs::Preferences>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<f8n::prefs::Preferences>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<f8n::prefs::Preferences>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<f8n::prefs::Preferences>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pluginCache_abi_cxx11_,&local_78);
    sVar6 = local_58._M_string_length;
    _Var13._M_p = local_58._M_dataplus._M_p;
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    p_Var4 = (pmVar8->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    (pmVar8->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)_Var13._M_p;
    (pmVar8->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
    }
  }
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<f8n::prefs::Preferences>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<f8n::prefs::Preferences>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<f8n::prefs::Preferences>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<f8n::prefs::Preferences>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pluginCache_abi_cxx11_,&local_78);
  (this->super_IPreferences)._vptr_IPreferences =
       (_func_int **)
       (pmVar8->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var4 = (pmVar8->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->mutex).super___mutex_base._M_mutex.__align = (long)p_Var4;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  _Var9._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    _Var9._M_pi = extraout_RDX_00;
  }
  sVar15.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  sVar15.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<f8n::prefs::Preferences>)
         sVar15.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Preferences> Preferences::ForPlugin(const std::string& pluginName) {
    std::string name = pluginFilename(pluginName);

    if (pluginCache.find(name) == pluginCache.end()) {
        pluginCache[name] = std::shared_ptr<Preferences>(
            new Preferences(name, Preferences::ModeAutoSave));
    }

    return pluginCache[name];
}